

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O0

target_ulong helper_find_slb_vsid(CPUPPCState_conflict2 *env,target_ulong rb)

{
  int iVar1;
  uintptr_t unaff_retaddr;
  target_ulong local_28;
  target_ulong rt;
  PowerPCCPU_conflict3 *cpu;
  target_ulong rb_local;
  CPUPPCState_conflict2 *env_local;
  
  cpu = (PowerPCCPU_conflict3 *)rb;
  rb_local = (target_ulong)env;
  rt = (target_ulong)env_archcpu(env);
  local_28 = 0;
  iVar1 = ppc_find_slb_vsid((PowerPCCPU_conflict3 *)rt,(target_ulong)cpu,&local_28);
  if (iVar1 < 0) {
    raise_exception_err_ra_ppc64((CPUPPCState_conflict2 *)rb_local,6,0x20,unaff_retaddr);
  }
  return local_28;
}

Assistant:

target_ulong helper_find_slb_vsid(CPUPPCState *env, target_ulong rb)
{
    PowerPCCPU *cpu = env_archcpu(env);
    target_ulong rt = 0;

    if (ppc_find_slb_vsid(cpu, rb, &rt) < 0) {
        raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                               POWERPC_EXCP_INVAL, GETPC());
    }
    return rt;
}